

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

bool ProvideOption(Option *Handler,StringRef ArgName,StringRef Value,int argc,char **argv,int *i)

{
  bool bVar1;
  bool bVar2;
  ValueExpected VVar3;
  size_t sVar4;
  raw_ostream *Errs;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  StringRef Value_00;
  StringRef Value_01;
  StringRef Value_02;
  StringRef local_b8;
  Twine local_a8;
  Twine local_90;
  Twine local_78;
  Twine local_60;
  Twine local_48;
  
  sVar4 = Value.Length;
  pcVar6 = Value.Data;
  uVar7 = Handler->AdditionalVals;
  local_b8.Data = pcVar6;
  local_b8.Length = sVar4;
  VVar3 = llvm::cl::Option::getValueExpectedFlag(Handler);
  if (VVar3 == ValueDisallowed) {
    if (uVar7 == 0) {
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)0x0;
        goto LAB_0013e183;
      }
      llvm::Twine::Twine(&local_60,"does not allow a value! \'");
      llvm::Twine::Twine(&local_78,&local_b8);
      llvm::Twine::concat(&local_48,&local_60,&local_78);
      llvm::Twine::Twine(&local_90,"\' specified.");
      llvm::Twine::concat(&local_a8,&local_48,&local_90);
      Errs = llvm::errs();
      goto LAB_0013e16c;
    }
    pcVar6 = "multi-valued option specified with ValueDisallowed modifier!";
  }
  else {
    if ((VVar3 == ValueRequired) && (pcVar6 == (char *)0x0)) {
      iVar8 = *i;
      iVar5 = iVar8 + 1;
      if (argc <= iVar5) {
        pcVar6 = "requires a value!";
        goto LAB_0013e152;
      }
      if (argv == (char **)0x0) {
        __assert_fail("argv && \"null check\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                      ,0x221,
                      "bool ProvideOption(Option *, StringRef, StringRef, int, const char *const *, int &)"
                     );
      }
      *i = iVar5;
      pcVar6 = argv[(long)iVar8 + 1];
      if (pcVar6 == (char *)0x0) {
        sVar4 = 0;
      }
      else {
        sVar4 = strlen(pcVar6);
      }
    }
    if (uVar7 == 0) {
LAB_0013e183:
      Value_02.Length = sVar4;
      Value_02.Data = pcVar6;
      bVar9 = CommaSeparateAndAddOccurrence(Handler,*i,ArgName,Value_02,false);
      return bVar9;
    }
    bVar9 = pcVar6 != (char *)0x0;
    if (bVar9) {
      Value_00.Length = sVar4;
      Value_00.Data = pcVar6;
      bVar1 = CommaSeparateAndAddOccurrence(Handler,*i,ArgName,Value_00,false);
      if (bVar1) {
        return true;
      }
      uVar7 = uVar7 - 1;
    }
    iVar8 = uVar7 + 1;
    while( true ) {
      iVar8 = iVar8 + -1;
      bVar1 = iVar8 != 0;
      if (iVar8 == 0) {
        return bVar1;
      }
      iVar5 = *i;
      uVar7 = iVar5 + 1;
      if (argc <= (int)uVar7) break;
      if (argv == (char **)0x0) {
        __assert_fail("argv && \"null check\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                      ,0x243,
                      "bool ProvideOption(Option *, StringRef, StringRef, int, const char *const *, int &)"
                     );
      }
      *i = uVar7;
      pcVar6 = argv[(long)iVar5 + 1];
      if (pcVar6 == (char *)0x0) {
        sVar4 = 0;
      }
      else {
        sVar4 = strlen(pcVar6);
      }
      Value_01.Length = sVar4;
      Value_01.Data = pcVar6;
      bVar2 = CommaSeparateAndAddOccurrence(Handler,uVar7,ArgName,Value_01,bVar9);
      bVar9 = true;
      if (bVar2) {
        return bVar1;
      }
    }
    pcVar6 = "not enough values!";
  }
LAB_0013e152:
  llvm::Twine::Twine(&local_a8,pcVar6);
  Errs = llvm::errs();
LAB_0013e16c:
  llvm::cl::Option::error(Handler,&local_a8,(StringRef)ZEXT816(0),Errs);
  return true;
}

Assistant:

static inline bool ProvideOption(Option *Handler, StringRef ArgName,
                                 StringRef Value, int argc,
                                 const char *const *argv, int &i) {
  // Is this a multi-argument option?
  unsigned NumAdditionalVals = Handler->getNumAdditionalVals();

  // Enforce value requirements
  switch (Handler->getValueExpectedFlag()) {
  case ValueRequired:
    if (!Value.data()) { // No value specified?
      if (i + 1 >= argc)
        return Handler->error("requires a value!");
      // Steal the next argument, like for '-o filename'
      assert(argv && "null check");
      Value = StringRef(argv[++i]);
    }
    break;
  case ValueDisallowed:
    if (NumAdditionalVals > 0)
      return Handler->error("multi-valued option specified"
                            " with ValueDisallowed modifier!");

    if (Value.data())
      return Handler->error("does not allow a value! '" + Twine(Value) +
                            "' specified.");
    break;
  case ValueOptional:
    break;
  }

  // If this isn't a multi-arg option, just run the handler.
  if (NumAdditionalVals == 0)
    return CommaSeparateAndAddOccurrence(Handler, i, ArgName, Value);

  // If it is, run the handle several times.
  bool MultiArg = false;

  if (Value.data()) {
    if (CommaSeparateAndAddOccurrence(Handler, i, ArgName, Value, MultiArg))
      return true;
    --NumAdditionalVals;
    MultiArg = true;
  }

  while (NumAdditionalVals > 0) {
    if (i + 1 >= argc)
      return Handler->error("not enough values!");
    assert(argv && "null check");
    Value = StringRef(argv[++i]);

    if (CommaSeparateAndAddOccurrence(Handler, i, ArgName, Value, MultiArg))
      return true;
    MultiArg = true;
    --NumAdditionalVals;
  }
  return false;
}